

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

uint __thiscall
CVmObjDict::calc_str_hash(CVmObjDict *this,vm_val_t *valstrval,char *valstr,size_t vallen)

{
  vm_dict_comp_type vVar1;
  vm_obj_id_t obj;
  vm_dict_ext *pvVar2;
  vm_val_t *pvVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  vm_val_t *in_RSI;
  CVmHashTable *in_RDI;
  vm_rcdesc rc;
  vm_val_t cobj_val;
  vm_val_t result;
  char *in_stack_ffffffffffffff48;
  vm_rcdesc *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff94;
  vm_val_t *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa6;
  vm_val_t *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  CVmRun *in_stack_ffffffffffffffb8;
  int local_38;
  vm_rcdesc *in_stack_ffffffffffffffd0;
  uint local_4;
  
  pvVar2 = get_ext((CVmObjDict *)in_RDI);
  vVar1 = pvVar2->comparator_type_;
  if (vVar1 == VMDICT_COMP_NONE) {
    get_ext((CVmObjDict *)in_RDI);
    local_4 = CVmHashTable::compute_hash
                        (in_RDI,in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  }
  else if (vVar1 == VMDICT_COMP_STRCOMP) {
    pvVar2 = get_ext((CVmObjDict *)in_RDI);
    local_4 = (*pvVar2->comparator_obj_->_vptr_CVmObject[0x3b])
                        (pvVar2->comparator_obj_,in_RDX,in_RCX);
  }
  else if (vVar1 == VMDICT_COMP_GENERIC) {
    if (in_RSI == (vm_val_t *)0x0) {
      pvVar3 = CVmStack::push();
      obj = CVmObjString::create
                      ((int)((ulong)in_RDI >> 0x20),(char *)pvVar3,(size_t)in_stack_ffffffffffffff50
                      );
      vm_val_t::set_obj(pvVar3,obj);
    }
    else {
      CVmStack::push(in_RSI);
    }
    vm_rcdesc::vm_rcdesc((vm_rcdesc *)&stack0xffffffffffffff70);
    vm_rcdesc::init_ret(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pvVar2 = get_ext((CVmObjDict *)in_RDI);
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,pvVar2->comparator_);
    CVmRun::get_prop(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa6,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     in_stack_ffffffffffffffd0);
    pvVar3 = CVmRun::get_r0();
    local_38 = (int)*(undefined8 *)pvVar3;
    if (local_38 != 7) {
      err_throw(0);
    }
    local_4 = (pvVar3->val).obj;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned int CVmObjDict::calc_str_hash(VMG_ const vm_val_t *valstrval,
                                       const char *valstr, size_t vallen)
{
    vm_val_t result;
    vm_val_t cobj_val;

    /* check what kind of comparator we have */
    switch(get_ext()->comparator_type_)
    {
    case VMDICT_COMP_NONE:
        /* no comparator - use the hash table's basic hash calculation */
        return get_ext()->hashtab_->compute_hash(valstr, vallen);

    case VMDICT_COMP_STRCOMP:
        /* calculate the hash directly with the StringComparator */
        return ((CVmObjStrComp *)get_ext()->comparator_obj_)->calc_str_hash(
            valstr, vallen);

    case VMDICT_COMP_GENERIC:
        /* push the value string */
        if (valstrval != 0)
        {
            /* push the value string as given */
            G_stk->push(valstrval);
        }
        else
        {
            /* no value string was given - create one and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE, valstr, vallen));
        }

        {
            /* set up a recursive call context */
            vm_rcdesc rc;
            rc.init_ret(vmg_ "HashComparator.calcHash");

            /* call the comparator object's calcHash method */
            cobj_val.set_obj(get_ext()->comparator_);
            G_interpreter->get_prop(vmg_ 0, &cobj_val,
                                    G_predef->calc_hash_prop,
                                    &cobj_val, 1, &rc);
        }

        /* get the result from R0 */
        result = *G_interpreter->get_r0();

        /* make sure it's an integer */
        if (result.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
            
        /* return the result */
        return (unsigned int)result.val.intval;
    }

    /* we should never get here, but just in case... */
    return 0;
}